

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

type * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
as<std::vector<(anonymous_namespace)::ns::Employee_NCGN,std::allocator<(anonymous_namespace)::ns::Employee_NCGN>>>
          (type *__return_storage_ptr__,
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this)

{
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *pbVar1;
  _Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
  *this_00;
  pointer pEVar2;
  iterator iVar3;
  pointer *extraout_RAX;
  pointer *extraout_RAX_00;
  pointer *extraout_RAX_01;
  conv_error *this_01;
  iterator this_02;
  const_array_range_type cVar4;
  error_code ec;
  type local_70;
  
  pbVar1 = this;
  while( true ) {
    if (1 < ((byte)*pbVar1 & 0xf) - 8) break;
    pbVar1 = *(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> **)(pbVar1 + 8);
  }
  if (((byte)*pbVar1 & 0xf) == 0xe) {
    (__return_storage_ptr__->
    super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pbVar1 = this;
    this_00 = (_Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
               *)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                           ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this
                           );
    if ((ulong)this_00 >> 0x39 == 0) {
      if (this_00 !=
          (_Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
           *)0x0) {
        pEVar2 = std::
                 _Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
                 ::_M_allocate(this_00,(size_t)pbVar1);
        (__return_storage_ptr__->
        super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
        )._M_impl.super__Vector_impl_data._M_start = pEVar2;
        (__return_storage_ptr__->
        super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
        )._M_impl.super__Vector_impl_data._M_finish = pEVar2;
        (__return_storage_ptr__->
        super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = pEVar2 + (long)this_00;
      }
      cVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
      iVar3 = cVar4.first_._M_current;
      if (iVar3._M_current != cVar4.last_._M_current._M_current) {
        this_02._M_current = iVar3._M_current;
        do {
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
          as<(anonymous_namespace)::ns::Employee_NCGN>(&local_70,this_02._M_current);
          std::
          vector<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
          ::push_back(__return_storage_ptr__,&local_70);
          iVar3._M_current =
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)extraout_RAX;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70.surname_._M_dataplus._M_p != &local_70.surname_.field_2) {
            operator_delete(local_70.surname_._M_dataplus._M_p,
                            local_70.surname_.field_2._M_allocated_capacity + 1);
            iVar3._M_current =
                 (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)extraout_RAX_00
            ;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_70.name_._M_dataplus._M_p._4_4_,
                          (uint)local_70.name_._M_dataplus._M_p) != &local_70.name_.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_70.name_._M_dataplus._M_p._4_4_,
                                     (uint)local_70.name_._M_dataplus._M_p),
                            local_70.name_.field_2._M_allocated_capacity + 1);
            iVar3._M_current =
                 (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)extraout_RAX_01
            ;
          }
          this_02._M_current = this_02._M_current + 0x10;
        } while (this_02._M_current != cVar4.last_._M_current._M_current);
      }
      return (type *)iVar3._M_current;
    }
    std::__throw_length_error("vector::reserve");
  }
  this_01 = (conv_error *)__cxa_allocate_exception(0x58);
  std::error_code::error_code<jsoncons::conv_errc,void>((error_code *)&local_70,not_vector);
  ec._4_4_ = 0;
  ec._M_value = (uint)local_70.name_._M_dataplus._M_p;
  ec._M_cat = (error_category *)local_70.name_._M_string_length;
  conv_error::conv_error(this_01,ec);
  __cxa_throw(this_01,&conv_error::typeinfo,conv_error::~conv_error);
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }